

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<bool,char_const(&)[1]>
          (String *__return_storage_ptr__,kj *this,bool *params,char (*params_1) [1])

{
  StringPtr local_38;
  ArrayPtr<const_char> local_28;
  
  local_28 = (ArrayPtr<const_char>)_::Stringifier::operator*((Stringifier *)&_::STR,(bool)*this);
  local_38.content.size_ = strlen(params);
  local_38.content.ptr = params;
  _::concat<kj::StringPtr,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,&local_38,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}